

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
duckdb::RLEInitAnalyze<unsigned_char>(ColumnData *col_data,PhysicalType type)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  undefined7 in_register_00000031;
  
  p_Var1 = *(_func_int **)(CONCAT71(in_register_00000031,type) + 0x18);
  pp_Var2 = (_func_int **)operator_new(0x30);
  pp_Var2[1] = p_Var1;
  *pp_Var2 = (_func_int *)&PTR__AnalyzeState_019ab8a0;
  pp_Var2[2] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var2 + 3) = 0;
  *(undefined2 *)((long)pp_Var2 + 0x1a) = 0;
  pp_Var2[4] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var2 + 5) = 1;
  col_data->_vptr_ColumnData = pp_Var2;
  return (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)
         (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)col_data;
}

Assistant:

unique_ptr<AnalyzeState> RLEInitAnalyze(ColumnData &col_data, PhysicalType type) {
	CompressionInfo info(col_data.GetBlockManager());
	return make_uniq<RLEAnalyzeState<T>>(info);
}